

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCompare(Gia_Man_t *p1,Gia_Man_t *p2)

{
  int iVar1;
  Gia_Obj_t *__s1;
  Gia_Obj_t *__s2;
  long lVar2;
  char *__format;
  ulong uVar3;
  
  if (p1->nObjs == p2->nObjs) {
    Gia_ManCleanValue(p1);
    Gia_ManCleanValue(p2);
    lVar2 = 0;
    for (uVar3 = 0; (long)uVar3 < (long)p1->nObjs; uVar3 = uVar3 + 1) {
      __s1 = Gia_ManObj(p1,(int)uVar3);
      if (__s1 == (Gia_Obj_t *)0x0) break;
      __s2 = Gia_ManObj(p2,(int)uVar3);
      iVar1 = bcmp(__s1,__s2,0xc);
      if (iVar1 != 0) {
        __format = "Objects %d are different.\n";
LAB_0021124b:
        printf(__format,uVar3 & 0xffffffff);
        return 0;
      }
      if (((p1->pReprs != (Gia_Rpr_t *)0x0) && (p2->pReprs != (Gia_Rpr_t *)0x0)) &&
         (*(int *)(&p1->pReprs->field_0x0 + lVar2) != *(int *)(&p2->pReprs->field_0x0 + lVar2))) {
        __format = "Representatives of objects %d are different.\n";
        goto LAB_0021124b;
      }
      lVar2 = lVar2 + 4;
    }
    iVar1 = 1;
  }
  else {
    puts("AIGs have different number of objects.");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Gia_ManCompare( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Obj_t * pObj1, * pObj2;
    int i;
    if ( Gia_ManObjNum(p1) != Gia_ManObjNum(p2) )
    {
        printf( "AIGs have different number of objects.\n" );
        return 0;
    }
    Gia_ManCleanValue( p1 );
    Gia_ManCleanValue( p2 );
    Gia_ManForEachObj( p1, pObj1, i )
    {
        pObj2 = Gia_ManObj( p2, i );
        if ( memcmp( pObj1, pObj2, sizeof(Gia_Obj_t) ) )
        {
            printf( "Objects %d are different.\n", i );
            return 0;
        }
        if ( p1->pReprs && p2->pReprs )
        {
            if ( memcmp( &p1->pReprs[i], &p2->pReprs[i], sizeof(Gia_Rpr_t) ) )
            {
                printf( "Representatives of objects %d are different.\n", i );
                return 0;
            }
        }
    }
    return 1;
}